

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O3

void __thiscall dynet::SparseInputNode::~SparseInputNode(SparseInputNode *this)

{
  pointer pfVar1;
  pointer puVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__SparseInputNode_005b8e70;
  pfVar1 = (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  puVar2 = (this->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  Node::~Node(&this->super_Node);
  operator_delete(this);
  return;
}

Assistant:

explicit SparseInputNode(const Dim& d, const std::vector<unsigned int>& id,
                           const std::vector<float>& dat, float defdat = 0.f)
      : dim(d), ids(id), data(dat), defdata(defdat) {}